

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::StreamExpressionSyntax::setChild
          (StreamExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  StreamExpressionWithRangeSyntax *local_40;
  ExpressionSyntax *local_38;
  ExpressionSyntax *local_20;
  not_null<slang::syntax::ExpressionSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x52123a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_38 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x52124a);
      local_38 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_20 = local_38;
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (local_18,&local_20);
    *(ExpressionSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x521295);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_40 = (StreamExpressionWithRangeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x5212a5);
      local_40 = SyntaxNode::as<slang::syntax::StreamExpressionWithRangeSyntax>(pSVar1);
    }
    *(StreamExpressionWithRangeSyntax **)(in_RDI + 0x20) = local_40;
  }
  return;
}

Assistant:

void StreamExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expression = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: withRange = child.node() ? &child.node()->as<StreamExpressionWithRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}